

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3IncrmergeHintStore(Fts3Table *p,Blob *pHint)

{
  int local_24;
  sqlite3_stmt *psStack_20;
  int rc;
  sqlite3_stmt *pReplace;
  Blob *pHint_local;
  Fts3Table *p_local;
  
  psStack_20 = (sqlite3_stmt *)0x0;
  pReplace = (sqlite3_stmt *)pHint;
  pHint_local = (Blob *)p;
  local_24 = fts3SqlStmt(p,0x17,&stack0xffffffffffffffe0,(sqlite3_value **)0x0);
  if (local_24 == 0) {
    sqlite3_bind_int(psStack_20,1,1);
    sqlite3_bind_blob(psStack_20,2,*(void **)pReplace,*(int *)(pReplace + 8),
                      (_func_void_void_ptr *)0x0);
    sqlite3_step(psStack_20);
    local_24 = sqlite3_reset(psStack_20);
    sqlite3_bind_null(psStack_20,2);
  }
  return local_24;
}

Assistant:

static int fts3IncrmergeHintStore(Fts3Table *p, Blob *pHint){
  sqlite3_stmt *pReplace = 0;
  int rc;                         /* Return code */

  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pReplace, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int(pReplace, 1, FTS_STAT_INCRMERGEHINT);
    sqlite3_bind_blob(pReplace, 2, pHint->a, pHint->n, SQLITE_STATIC);
    sqlite3_step(pReplace);
    rc = sqlite3_reset(pReplace);
    sqlite3_bind_null(pReplace, 2);
  }

  return rc;
}